

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

BOOL get_ucp(PCRE2_SPTR8 *ptrptr,BOOL *negptr,uint *ptypeptr,uint *pdataptr,int *errorcodeptr,
            compile_block_8 *cb)

{
  byte bVar1;
  PCRE2_SPTR8 pPVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  byte local_78 [4];
  int r;
  PCRE2_UCHAR8 name [32];
  PCRE2_SPTR8 ptr;
  int top;
  int bot;
  int i;
  PCRE2_UCHAR8 c;
  compile_block_8 *cb_local;
  int *errorcodeptr_local;
  uint *pdataptr_local;
  uint *ptypeptr_local;
  BOOL *negptr_local;
  PCRE2_SPTR8 *ptrptr_local;
  
  pPVar2 = *ptrptr;
  *negptr = 0;
  name._24_8_ = pPVar2 + 1;
  bVar1 = pPVar2[1];
  if (bVar1 == 0x7b) {
    if (pPVar2[2] == '^') {
      *negptr = 1;
      name._24_8_ = pPVar2 + 2;
    }
    bot._3_1_ = 0x7b;
    for (top = 0; top < 0x1f; top = top + 1) {
      lVar5 = name._24_8_ + 1;
      bot._3_1_ = *(byte *)(name._24_8_ + 1);
      name._24_8_ = lVar5;
      if (bot._3_1_ == 0) goto LAB_0011ee9b;
      if (bot._3_1_ == 0x7d) break;
      local_78[top] = bot._3_1_;
    }
    if (bot._3_1_ == 0x7d) {
      local_78[top] = 0;
LAB_0011edc2:
      *ptrptr = (PCRE2_SPTR8)name._24_8_;
      ptr._4_4_ = 0;
      iVar3 = 0xa9;
      while( true ) {
        ptr._0_4_ = iVar3;
        if ((int)ptr <= ptr._4_4_) {
          *errorcodeptr = 0x93;
          return 0;
        }
        iVar3 = ptr._4_4_ + (int)ptr >> 1;
        iVar4 = _pcre2_strcmp_c8_8(local_78,"Any" + (int)(uint)_pcre2_utt_8[iVar3].name_offset);
        if (iVar4 == 0) break;
        if (0 < iVar4) {
          ptr._4_4_ = iVar3 + 1;
          iVar3 = (int)ptr;
        }
      }
      *ptypeptr = (uint)_pcre2_utt_8[iVar3].type;
      *pdataptr = (uint)_pcre2_utt_8[iVar3].value;
      return 1;
    }
  }
  else if ((cb->ctypes[bVar1] & 2) != 0) {
    local_78[1] = 0;
    local_78[0] = bVar1;
    goto LAB_0011edc2;
  }
LAB_0011ee9b:
  *errorcodeptr = 0x92;
  *ptrptr = (PCRE2_SPTR8)name._24_8_;
  return 0;
}

Assistant:

static BOOL
get_ucp(PCRE2_SPTR *ptrptr, BOOL *negptr, unsigned int *ptypeptr,
  unsigned int *pdataptr, int *errorcodeptr, compile_block *cb)
{
register PCRE2_UCHAR c;
int i, bot, top;
PCRE2_SPTR ptr = *ptrptr;
PCRE2_UCHAR name[32];

*negptr = FALSE;
c = *(++ptr);

/* \P or \p can be followed by a name in {}, optionally preceded by ^ for
negation. */

if (c == CHAR_LEFT_CURLY_BRACKET)
  {
  if (ptr[1] == CHAR_CIRCUMFLEX_ACCENT)
    {
    *negptr = TRUE;
    ptr++;
    }
  for (i = 0; i < (int)(sizeof(name) / sizeof(PCRE2_UCHAR)) - 1; i++)
    {
    c = *(++ptr);
    if (c == CHAR_NULL) goto ERROR_RETURN;
    if (c == CHAR_RIGHT_CURLY_BRACKET) break;
    name[i] = c;
    }
  if (c != CHAR_RIGHT_CURLY_BRACKET) goto ERROR_RETURN;
  name[i] = 0;
  }

/* Otherwise there is just one following character, which must be an ASCII
letter. */

else if (MAX_255(c) && (cb->ctypes[c] & ctype_letter) != 0)
  {
  name[0] = c;
  name[1] = 0;
  }
else goto ERROR_RETURN;

*ptrptr = ptr;

/* Search for a recognized property name using binary chop. */

bot = 0;
top = PRIV(utt_size);

while (bot < top)
  {
  int r;
  i = (bot + top) >> 1;
  r = PRIV(strcmp_c8)(name, PRIV(utt_names) + PRIV(utt)[i].name_offset);
  if (r == 0)
    {
    *ptypeptr = PRIV(utt)[i].type;
    *pdataptr = PRIV(utt)[i].value;
    return TRUE;
    }
  if (r > 0) bot = i + 1; else top = i;
  }
*errorcodeptr = ERR47;   /* Unrecognized name */
return FALSE;

ERROR_RETURN:            /* Malformed \P or \p */
*errorcodeptr = ERR46;
*ptrptr = ptr;
return FALSE;
}